

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryPool.cpp
# Opt level: O2

void __thiscall primesieve::MemoryPool::initBuckets(MemoryPool *this,void *memory,size_t bytes)

{
  long lVar1;
  long *plVar2;
  primesieve_error *ppVar3;
  long lVar4;
  long lVar5;
  bool bVar6;
  allocator<char> local_39;
  string local_38;
  
  this->count_ = bytes >> 0xd;
  if (((ulong)memory & 0x1fff) != 0) {
    ppVar3 = (primesieve_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"MemoryPool: failed to align memory!",&local_39);
    primesieve_error::primesieve_error(ppVar3,&local_38);
    __cxa_throw(ppVar3,&primesieve_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (0x13fff < bytes) {
    lVar1 = (bytes >> 0xd) - 1;
    lVar4 = (long)memory + 0x2000;
    lVar5 = lVar1;
    while (bVar6 = lVar5 != 0, lVar5 = lVar5 + -1, bVar6) {
      *(long *)(lVar4 + -0x2000) = lVar4 + -0x1ff0;
      *(long *)(lVar4 + -0x1ff8) = lVar4;
      lVar4 = lVar4 + 0x2000;
    }
    plVar2 = (long *)(lVar1 * 0x2000 + (long)memory);
    *plVar2 = (long)(plVar2 + 2);
    plVar2[1] = 0;
    this->stock_ = (Bucket *)memory;
    return;
  }
  ppVar3 = (primesieve_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"MemoryPool: insufficient buckets allocated!",&local_39);
  primesieve_error::primesieve_error(ppVar3,&local_38);
  __cxa_throw(ppVar3,&primesieve_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void MemoryPool::initBuckets(void* memory, size_t bytes)
{
  Bucket* buckets = (Bucket*) memory;
  count_ = bytes / sizeof(Bucket);
  size_t i = 0;

  if ((size_t) buckets % sizeof(Bucket) != 0)
    throw primesieve_error("MemoryPool: failed to align memory!");

  if (count_ < 10)
    throw primesieve_error("MemoryPool: insufficient buckets allocated!");

  for (; i + 1 < count_; i++)
  {
    buckets[i].reset();
    buckets[i].setNext(&buckets[i + 1]);
  }

  buckets[i].reset();
  buckets[i].setNext(nullptr);
  stock_ = buckets;
}